

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_err_t * mpc_err_fail(mpc_input_t *i,char *failure)

{
  undefined4 uVar1;
  char *pcVar2;
  char *in_RSI;
  mpc_input_t *in_RDI;
  mpc_err_t *x;
  size_t in_stack_ffffffffffffffd0;
  mpc_input_t *n;
  mpc_input_t *in_stack_ffffffffffffffd8;
  mpc_err_t *local_8;
  
  if (in_RDI->suppress == 0) {
    local_8 = (mpc_err_t *)mpc_malloc(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    n = in_RDI;
    strlen(in_RDI->filename);
    pcVar2 = (char *)mpc_malloc(in_stack_ffffffffffffffd8,(size_t)n);
    local_8->filename = pcVar2;
    strcpy(local_8->filename,in_RDI->filename);
    (local_8->state).pos = (in_RDI->state).pos;
    (local_8->state).row = (in_RDI->state).row;
    (local_8->state).col = (in_RDI->state).col;
    uVar1 = *(undefined4 *)&(in_RDI->state).field_0x1c;
    (local_8->state).term = (in_RDI->state).term;
    *(undefined4 *)&(local_8->state).field_0x1c = uVar1;
    local_8->expected_num = 0;
    local_8->expected = (char **)0x0;
    strlen(in_RSI);
    pcVar2 = (char *)mpc_malloc(in_RDI,(size_t)n);
    local_8->failure = pcVar2;
    strcpy(local_8->failure,in_RSI);
    local_8->received = ' ';
  }
  else {
    local_8 = (mpc_err_t *)0x0;
  }
  return local_8;
}

Assistant:

static mpc_err_t *mpc_err_fail(mpc_input_t *i, const char *failure) {
  mpc_err_t *x;
  if (i->suppress) { return NULL; }
  x = mpc_malloc(i, sizeof(mpc_err_t));
  x->filename = mpc_malloc(i, strlen(i->filename) + 1);
  strcpy(x->filename, i->filename);
  x->state = i->state;
  x->expected_num = 0;
  x->expected = NULL;
  x->failure = mpc_malloc(i, strlen(failure) + 1);
  strcpy(x->failure, failure);
  x->received = ' ';
  return x;
}